

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestCase::createInstance
          (FillRuleTestCase *this,Context *context)

{
  VkSampleCountFlagBits sampleCount;
  FillRuleCaseType FVar1;
  BaseRenderingTestInstance *this_00;
  deUint32 renderSize;
  undefined4 uVar2;
  FillRuleCaseType FVar3;
  
  this_00 = (BaseRenderingTestInstance *)operator_new(0x290);
  sampleCount = (this->super_BaseRenderingTestCase).m_sampleCount;
  FVar1 = this->m_type;
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d2ffd8;
  FVar3 = FVar1 & ~FILLRULECASE_REVERSED;
  renderSize = 0x100;
  if (FVar3 == FILLRULECASE_CLIPPED_FULL) {
    renderSize = 0x40;
  }
  BaseRenderingTestInstance::BaseRenderingTestInstance(this_00,context,sampleCount,renderSize);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d2ffd8;
  *(FillRuleCaseType *)&this_00[1].super_TestInstance._vptr_TestInstance = FVar1;
  uVar2 = 2;
  if (FVar3 == FILLRULECASE_CLIPPED_FULL) {
    uVar2 = 0xf;
  }
  *(undefined4 *)((long)&this_00[1].super_TestInstance._vptr_TestInstance + 4) = 0;
  *(undefined4 *)&this_00[1].super_TestInstance.m_context = uVar2;
  *(undefined1 *)((long)&this_00[1].super_TestInstance.m_context + 4) = 1;
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*		createInstance		(Context& context) const
								{
									return new FillRuleTestInstance(context, m_type, m_sampleCount);
								}